

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_A_MissileAttack
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *self;
  int iVar1;
  undefined4 extraout_var;
  PClass *pPVar2;
  undefined4 extraout_var_00;
  PClass *pPVar3;
  PClassActor *MissileType;
  undefined4 extraout_var_01;
  char *__assertion;
  bool bVar4;
  undefined8 local_18;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      self = (AActor *)(param->field_0).field_1.a;
      if (self != (AActor *)0x0) {
        if ((self->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar1 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
          (self->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar1);
        }
        pPVar2 = (self->super_DThinker).super_DObject.Class;
        bVar4 = pPVar2 != (PClass *)0x0;
        if (pPVar2 != pPVar3 && bVar4) {
          do {
            pPVar2 = pPVar2->ParentClass;
            bVar4 = pPVar2 != (PClass *)0x0;
            if (pPVar2 == pPVar3) break;
          } while (pPVar2 != (PClass *)0x0);
        }
        if (!bVar4) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003c73b5;
        }
      }
      if ((self->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar1 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
        (self->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_00,iVar1);
      }
      local_18._4_4_ =
           *(uint *)((long)&(self->super_DThinker).super_DObject.Class[1].ParentClass + 4);
      pPVar3 = PClass::FindClass((FName *)((long)&local_18 + 4));
      MissileType = dyn_cast<PClassActor>((DObject *)pPVar3);
      local_18 = (ulong)local_18._4_4_ << 0x20;
      if ((self->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar1 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
        (self->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_01,iVar1);
      }
      DoAttack(self,false,true,0,(FSoundID *)&local_18,MissileType,
               (double)(self->super_DThinker).super_DObject.Class[1].Pointers);
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003c73b5:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x3cb,
                "int AF_AActor_A_MissileAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_MissileAttack)
{
	PARAM_SELF_PROLOGUE(AActor);
	PClassActor *MissileType = PClass::FindActor(self->GetClass()->MissileName);
	DoAttack(self, false, true, 0, 0, MissileType, self->GetClass()->MissileHeight);
	return 0;
}